

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O2

void ResponseHandleParserEvent(HttpTestListener *req,int type,char *buf,int len)

{
  mapped_type *pmVar1;
  ulong uVar2;
  string *psVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec_query_pair;
  string query;
  string str_pair;
  http_parser_url url;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [16];
  allocator<char> local_d0 [32];
  string local_b0 [32];
  byte local_90 [20];
  ushort local_7c;
  key_type local_70;
  string local_50 [32];
  
  switch(type) {
  case 2:
    std::__cxx11::string::assign((char *)&req->request_url_,(ulong)buf);
    http_parser_parse_url_(buf,(long)len,0,local_90);
    if ((local_90[0] & 0x10) != 0) {
      local_f0 = local_e0;
      local_e8 = 0;
      local_e0[0] = 0;
      std::__cxx11::string::assign((char *)&local_f0,(ulong)(buf + local_7c));
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"&",local_d0);
      strsplit(&local_f0,&local_118,local_b0);
      std::__cxx11::string::~string(local_b0);
      local_f8 = &req->map_request_query_;
      lVar4 = 0;
      for (uVar2 = 0;
          uVar2 < (ulong)((long)local_118.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_118.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1)
      {
        std::__cxx11::string::string
                  ((string *)local_d0,
                   (string *)
                   ((long)&((local_118.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4))
        ;
        std::__cxx11::string::find((char *)local_d0,0x10621e);
        std::__cxx11::string::substr((ulong)local_50,(ulong)local_d0);
        std::__cxx11::string::substr((ulong)&local_70,(ulong)local_d0);
        pmVar1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_f8,&local_70);
        std::__cxx11::string::operator=((string *)pmVar1,local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string((string *)local_d0);
        lVar4 = lVar4 + 0x20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    break;
  case 3:
    if (req->is_last_value_ == true) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_request_header_,&req->last_request_field_);
      std::__cxx11::string::_M_assign((string *)pmVar1);
      std::__cxx11::string::assign((char *)&req->last_request_field_);
      std::__cxx11::string::assign((char *)&req->last_request_value_);
    }
    std::__cxx11::string::append((char *)&req->last_request_field_,(ulong)buf);
    req->is_last_value_ = false;
    break;
  case 4:
    req->is_last_value_ = true;
    psVar3 = &req->last_request_value_;
    goto LAB_00104ec4;
  case 5:
    if ((req->last_request_field_)._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_request_header_,&req->last_request_field_);
      std::__cxx11::string::_M_assign((string *)pmVar1);
      std::__cxx11::string::assign((char *)&req->last_request_field_);
      std::__cxx11::string::assign((char *)&req->last_request_value_);
    }
    http_method_str_(req->parser_->method);
    std::__cxx11::string::assign((char *)&req->request_method_);
    return;
  case 6:
    psVar3 = &req->request_body_;
LAB_00104ec4:
    std::__cxx11::string::append((char *)psVar3,(ulong)buf);
    return;
  case 7:
    req->is_request_complete_ = true;
  }
  return;
}

Assistant:

void ResponseHandleParserEvent(HttpTestListener* req, int type, char* buf, int len) {
  switch(type) {
  case PARSER_EVENT_URL: {
    req->request_url_.assign(buf, len);
    http_parser_url url;
    http_parser_parse_url_(buf, len, 0, &url);
    if(url.field_set & 1 << (UF_QUERY)) {
      std::string query;
      query.assign(&buf[url.field_data[UF_QUERY].off], url.field_data[UF_QUERY].len);
      std::vector<std::string> vec_query_pair;
      strsplit(query, vec_query_pair, "&");
      for(int i = 0; i < vec_query_pair.size(); i++) {
        std::string str_pair = vec_query_pair[i];
        int pos = str_pair.find("=");
        req->map_request_query_[str_pair.substr(0, pos)] = str_pair.substr(pos + 1, str_pair.size() - pos - 1);
      }
    }
    
    break;
  }
  case PARSER_EVENT_FIELD: {
    if(req->is_last_value_) {
      req->map_request_header_[req->last_request_field_] = req->last_request_value_;
      req->last_request_field_ = "";
      req->last_request_value_ = "";
    }
     req->last_request_field_.append(buf, len);
     req->is_last_value_ = false;
  }
    break;

  case PARSER_EVENT_VALUE: {
    req->is_last_value_ = true;
    req->last_request_value_.append(buf, len);
    break;
  }

  case PARSER_EVENT_HEADER_COMPLETE: {
    if(req->last_request_field_.size() > 0) {
      req->map_request_header_[req->last_request_field_] = req->last_request_value_;
      req->last_request_field_ = "";
      req->last_request_value_ = "";
    }

    req->request_method_ = http_method_str_((http_method)req->parser_->method);
    break;
  }
  case PARSER_EVENT_BODY: {
    req->request_body_.append(buf, len);
    break;
  }

  case PARSER_EVENT_MSG_COMPLETE: {
    req->is_request_complete_ = true;
    break;
  }
}

}